

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastV64R2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  ulong uVar5;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar6;
  ulong uVar7;
  RepeatedField<unsigned_long> *this;
  char *pcVar8;
  uint *puVar9;
  
  if (data.field_0._0_2_ != 0) {
    pcVar8 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar8;
  }
  this = (RepeatedField<unsigned_long> *)
         ((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)this & 7) == 0) {
    uVar2 = *(ushort *)ptr;
    while( true ) {
      pcVar8 = (char *)(long)(char)*(ushort *)((long)ptr + 2);
      if ((long)pcVar8 < 0) {
        uVar5 = (long)*(char *)((long)ptr + 3) << 7 | 0x7f;
        if ((long)uVar5 < 0) {
          aVar6.data = (long)(char)*(ushort *)((long)ptr + 4) << 0xe | 0x3fff;
          if ((long)aVar6 < 0) {
            uVar5 = uVar5 & ((long)*(char *)((long)ptr + 5) << 0x15 | 0x1fffffU);
            if ((long)uVar5 < 0) {
              aVar6.data = aVar6.data &
                           ((long)(char)*(ushort *)((long)ptr + 6) << 0x1c | 0xfffffffU);
              if ((long)aVar6.data < 0) {
                uVar5 = uVar5 & ((long)*(char *)((long)ptr + 7) << 0x23 | 0x7ffffffffU);
                if ((long)uVar5 < 0) {
                  aVar6.data = aVar6.data &
                               ((long)(char)*(ushort *)((long)ptr + 8) << 0x2a | 0x3ffffffffffU);
                  if ((long)aVar6 < 0) {
                    uVar5 = uVar5 & ((long)*(char *)((long)ptr + 9) << 0x31 | 0x1ffffffffffffU);
                    if ((long)uVar5 < 0) {
                      uVar7 = (ulong)(byte)*(ushort *)((long)ptr + 10) << 0x38 | 0xffffffffffffff;
                      aVar6.data = aVar6.data & uVar7;
                      if ((long)aVar6 < 0) {
                        bVar1 = *(byte *)((long)ptr + 0xb);
                        ptr = (char *)((long)ptr + 0xc);
                        if (bVar1 != 1) {
                          if ((char)bVar1 < '\0') {
                            pcVar8 = Error(msg,pcVar8,
                                           (ParseContext *)CONCAT71((int7)(uVar7 >> 8),bVar1),
                                           (TcFieldData)aVar6,table,hasbits);
                            return pcVar8;
                          }
                          if ((bVar1 & 1) == 0) {
                            aVar6.data = aVar6.data ^ 0x8000000000000000;
                          }
                        }
                      }
                      else {
                        ptr = (char *)((long)ptr + 0xb);
                      }
                    }
                    else {
                      ptr = (char *)((long)ptr + 10);
                    }
                  }
                  else {
                    ptr = (char *)((long)ptr + 9);
                  }
                }
                else {
                  ptr = (char *)((long)ptr + 8);
                }
              }
              else {
                ptr = (char *)((long)ptr + 7);
              }
            }
            else {
              ptr = (char *)((long)ptr + 6);
            }
          }
          else {
            ptr = (char *)((long)ptr + 5);
          }
          uVar5 = uVar5 & aVar6.data;
        }
        else {
          ptr = (char *)((long)ptr + 4);
        }
        pcVar8 = (char *)((ulong)pcVar8 & uVar5);
      }
      else {
        ptr = (char *)((long)ptr + 3);
      }
      RepeatedField<unsigned_long>::Add(this,(unsigned_long)pcVar8);
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) break;
      uVar3 = *(ushort *)ptr;
      if (uVar3 != uVar2) {
        uVar4 = (uint)table->fast_idx_mask & (uint)uVar3;
        if ((uVar4 & 7) == 0) {
          uVar5 = (ulong)(uVar4 & 0xfffffff8);
          pcVar8 = (char *)(**(code **)(&table[1].has_bits_offset + uVar5))
                                     (msg,ptr,ctx,
                                      (ulong)uVar3 ^ *(ulong *)(&table[1].fast_idx_mask + uVar5 * 2)
                                      ,table,hasbits);
          return pcVar8;
        }
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x44d);
      }
    }
    if ((ulong)table->has_bits_offset != 0) {
      puVar9 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar9 & 3) != 0) {
        AlignFail(puVar9);
      }
      *puVar9 = *puVar9 | (uint)hasbits;
    }
    return (char *)(ushort *)ptr;
  }
  AlignFail(this);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastV64R2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedVarint<uint64_t, uint16_t>(
      PROTOBUF_TC_PARAM_PASS);
}